

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

void FAudio_UnregisterForCallbacks(FAudio *audio,FAudioEngineCallback *pCallback)

{
  LinkedList_RemoveEntry(&audio->callbacks,pCallback,audio->callbackLock,audio->pFree);
  return;
}

Assistant:

void FAudio_UnregisterForCallbacks(
	FAudio *audio,
	FAudioEngineCallback *pCallback
) {
	LOG_API_ENTER(audio)
	LinkedList_RemoveEntry(
		&audio->callbacks,
		pCallback,
		audio->callbackLock,
		audio->pFree
	);
	LOG_API_EXIT(audio)
}